

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O2

void PatchFixSoftlocks::fix_reverse_greenmaze_fountain_softlock(World *world)

{
  Entity *this;
  Entity *this_00;
  Map *pMVar1;
  Flag is_mercator_fountain_open;
  Attributes local_c8;
  Attributes local_78;
  
  is_mercator_fountain_open._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  is_mercator_fountain_open.byte = 0xe;
  is_mercator_fountain_open.bit = '\x01';
  this = (Entity *)operator_new(0x58);
  local_78.type_id = '\x15';
  local_78.position.x = '\x15';
  local_78.position.y = '\x16';
  local_78.position.z = '\0';
  local_78.position.half_x = false;
  local_78.position.half_y = false;
  local_78.position.half_z = false;
  local_78.orientation = '\0';
  local_78.palette = '\x02';
  local_78.behavior_id = 0;
  local_78.speed = '\0';
  local_78.fightable = false;
  local_78.liftable = false;
  local_78.can_pass_through = false;
  local_78.appear_after_player_moved_away = false;
  local_78.gravity_immune = false;
  local_78.talkable = false;
  local_78.dialogue = '\0';
  local_78.entity_to_use_tiles_from = (Entity *)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_78.persistence_flag.byte = 0xff;
  local_78.persistence_flag.bit = 0xff;
  local_78.flag_unknown_2_3 = false;
  local_78.flag_unknown_2_4 = false;
  local_78.flag_unknown_3_5 = false;
  Entity::Entity(this,&local_78);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_78.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Entity::remove_when_flag_is_set(this,&is_mercator_fountain_open);
  this_00 = (Entity *)operator_new(0x58);
  local_c8.type_id = '\x15';
  local_c8.position.x = '\x15';
  local_c8.position.y = '\x17';
  local_c8.position.z = '\0';
  local_c8.position.half_x = false;
  local_c8.position.half_y = false;
  local_c8.position.half_z = false;
  local_c8.orientation = '\0';
  local_c8.palette = '\x02';
  local_c8.behavior_id = 0;
  local_c8.speed = '\0';
  local_c8.fightable = false;
  local_c8.liftable = false;
  local_c8.can_pass_through = false;
  local_c8.appear_after_player_moved_away = false;
  local_c8.gravity_immune = false;
  local_c8.talkable = false;
  local_c8.dialogue = '\0';
  local_c8.entity_to_use_tiles_from = (Entity *)0x0;
  local_c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_c8.persistence_flag.byte = 0xff;
  local_c8.persistence_flag.bit = 0xff;
  local_c8.flag_unknown_2_3 = false;
  local_c8.flag_unknown_2_4 = false;
  local_c8.flag_unknown_3_5 = false;
  Entity::Entity(this_00,&local_c8);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_c8.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Entity::remove_when_flag_is_set(this_00,&is_mercator_fountain_open);
  pMVar1 = World::map(world,0x1cc);
  Map::add_entity(pMVar1,this);
  pMVar1 = World::map(world,0x1cc);
  Map::add_entity(pMVar1,this_00);
  return;
}

Assistant:

static void fix_reverse_greenmaze_fountain_softlock(World& world)
    {
        Flag is_mercator_fountain_open(0xE, 1);

        Entity* platform_1 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 22, 0, false, false, false),
                .palette = 2
        });
        platform_1->remove_when_flag_is_set(is_mercator_fountain_open);

        Entity* platform_2 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 23, 0, false, false, false),
                .palette = 2
        });
        platform_2->remove_when_flag_is_set(is_mercator_fountain_open);

        world.map(MAP_460)->add_entity(platform_1);
        world.map(MAP_460)->add_entity(platform_2);
    }